

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableRead.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::VariableRead::dump_abi_cxx11_
          (string *__return_storage_ptr__,VariableRead *this,int level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)level);
  std::operator+(&local_38,&local_58,"VariableRead: ");
  std::operator+(__return_storage_ptr__,&local_38,&this->name);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::VariableRead::dump(int level) const {
    return std::string(level, '\t')+"VariableRead: "+name;
}